

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::ES5ArrayTypeHandlerBase<int>::HasAnyDataItemNotInMap
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr)

{
  IndexPropertyDescriptorMap *pIVar1;
  bool bVar2;
  bool bVar3;
  undefined1 local_50 [8];
  ArrayElementEnumerator e;
  
  JavascriptArray::ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_50,&arr->super_JavascriptArray,0,0xffffffff);
  do {
    bVar2 = JavascriptArray::ArrayElementEnumerator::MoveNext<void*>
                      ((ArrayElementEnumerator *)local_50);
    if (!bVar2) {
      return bVar2;
    }
    pIVar1 = (this->indexPropertyMap).ptr;
    e.end = JavascriptArray::ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_50);
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey((pIVar1->indexPropertyMap).ptr,&e.end);
  } while (bVar3);
  return bVar2;
}

Assistant:

bool ES5ArrayTypeHandlerBase<T>::HasAnyDataItemNotInMap(ES5Array* arr)
    {
        JavascriptArray::ArrayElementEnumerator e(arr);
        while (e.MoveNext<Var>())
        {
            if (!indexPropertyMap->ContainsKey(e.GetIndex()))
            {
                return true;
            }
        }

        return false;
    }